

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O0

bool __thiscall
Parameter<unsigned_long>::setData
          (Parameter<unsigned_long> *this,vector<double,_std::allocator<double>_> *pval)

{
  bool bVar1;
  vector<double,_std::allocator<double>_> *in_RDI;
  Parameter<unsigned_long> *unaff_retaddr;
  vector<double,_std::allocator<double>_> *in_stack_00000008;
  vector<double,_std::allocator<double>_> *in_stack_00000010;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffd0;
  
  std::vector<double,_std::allocator<double>_>::vector(in_stack_00000010,in_stack_00000008);
  bVar1 = internalSetData<std::vector<double,std::allocator<double>>>(unaff_retaddr,in_RDI);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffffd0);
  return bVar1;
}

Assistant:

virtual bool setData(std::vector<RealType> pval) {
    return internalSetData<std::vector<RealType>>(pval);
  }